

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout.cpp
# Opt level: O2

void __thiscall
QGraphicsAnchorLayout::addAnchors
          (QGraphicsAnchorLayout *this,QGraphicsLayoutItem *firstItem,
          QGraphicsLayoutItem *secondItem,Orientations orientations)

{
  QGraphicsAnchor *pQVar1;
  
  if (((uint)orientations.super_QFlagsStorageHelper<Qt::Orientation,_4>.
             super_QFlagsStorage<Qt::Orientation>.i & 1) != 0) {
    pQVar1 = addAnchor(this,secondItem,AnchorLeft,firstItem,AnchorLeft);
    if (pQVar1 == (QGraphicsAnchor *)0x0) {
      return;
    }
    addAnchor(this,firstItem,AnchorRight,secondItem,AnchorRight);
  }
  if (((uint)orientations.super_QFlagsStorageHelper<Qt::Orientation,_4>.
             super_QFlagsStorage<Qt::Orientation>.i & 2) == 0) {
    return;
  }
  addAnchor(this,secondItem,AnchorTop,firstItem,AnchorTop);
  addAnchor(this,firstItem,AnchorBottom,secondItem,AnchorBottom);
  return;
}

Assistant:

void QGraphicsAnchorLayout::addAnchors(QGraphicsLayoutItem *firstItem,
                                       QGraphicsLayoutItem *secondItem,
                                       Qt::Orientations orientations)
{
    bool ok = true;
    if (orientations & Qt::Horizontal) {
        // Currently, if the first is ok, then the rest of the calls should be ok
        ok = addAnchor(secondItem, Qt::AnchorLeft, firstItem, Qt::AnchorLeft) != nullptr;
        if (ok)
            addAnchor(firstItem, Qt::AnchorRight, secondItem, Qt::AnchorRight);
    }
    if (orientations & Qt::Vertical && ok) {
        addAnchor(secondItem, Qt::AnchorTop, firstItem, Qt::AnchorTop);
        addAnchor(firstItem, Qt::AnchorBottom, secondItem, Qt::AnchorBottom);
    }
}